

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_452187::HandleCreateLinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *filename;
  string *filename_00;
  pointer pbVar1;
  size_t __n;
  cmMakefile *this;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Status SVar5;
  ostream *poVar6;
  offset_in_Arguments_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_RCX;
  ActionMap *pAVar7;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  string result;
  Status linked;
  Arguments arguments;
  Status copied;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  ostringstream e;
  undefined1 local_288 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  char *local_258;
  char *local_250;
  char local_248;
  undefined7 uStack_247;
  Status local_238;
  undefined1 local_230 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [8];
  pointer ppStack_1a0;
  undefined1 local_198 [24];
  _Any_data _Stack_180;
  undefined1 auStack_170 [16];
  _Any_data _Stack_160;
  pointer ppStack_150;
  pointer local_148;
  pointer ppStack_140;
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "CREATE_LINK must be called with at least two additional arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,(ulong)(local_198._0_8_ + 1));
    }
    return false;
  }
  if (((anonymous_namespace)::
       HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    local_148 = (pointer)0x0;
    ppStack_140 = (pointer)0x0;
    _Stack_160._8_8_ = (_Manager_type)0x0;
    ppStack_150 = (pointer)0x0;
    auStack_170._8_8_ = 0;
    _Stack_160._0_8_ = 0;
    _Stack_180._8_8_ = 0;
    auStack_170._0_8_ = (_Manager_type)0x0;
    local_198._16_8_ = (pointer)0x0;
    _Stack_180._M_unused._M_object = (char *)0x0;
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_1a8 = (undefined1  [8])0x0;
    ppStack_1a0 = (pointer)0x0;
    name.super_string_view._M_str = "RESULT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_1a8,name,in_RCX);
    name_00.super_string_view._M_str = "COPY_ON_ERROR";
    name_00.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1a8,name_00,0x20);
    name_01.super_string_view._M_str = "SYMBOLIC";
    name_01.super_string_view._M_len = 8;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_1a8,name_01,0x21);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleCreateLinkCommand::parser,(ActionMap *)local_1a8);
    ArgumentParser::Base::~Base((Base *)local_1a8);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleCreateLinkCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_198._0_8_ = local_1c8;
  local_1c8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8._16_8_ = (pointer)0x0;
  local_288._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_288._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 3;
  local_230._8_8_ = 0;
  local_230[0x10] = '\0';
  local_230._32_2_ = 0;
  local_1a8 = (undefined1  [8])&HandleCreateLinkCommand::parser;
  ppStack_1a0 = (pointer)0x0;
  local_198._8_8_ = local_230;
  local_198._16_8_ = (pointer)0x0;
  _Stack_180._M_unused._M_object = (char *)0x0;
  _Stack_180._8_8_ = 0;
  auStack_170._0_8_ = (_Manager_type)0x0;
  auStack_170._8_8_ = 0;
  _Stack_160._0_8_ = 0;
  _Stack_160._8_8_ = (_Manager_type)0x0;
  ppStack_150 = (pointer)0x0;
  local_148 = (pointer)((ulong)local_148 & 0xffffffffffffff00);
  local_230._0_8_ = local_230 + 0x10;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_1a8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_288,0);
  if ((_Manager_type)_Stack_160._8_8_ != (_Manager_type)0x0) {
    (*(code *)_Stack_160._8_8_)(auStack_170 + 8,auStack_170 + 8,3);
  }
  if (local_1c8._0_8_ != local_1c8._8_8_) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   "unknown argument: \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1c8._0_8_);
    plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_288,local_288._8_8_,0,'\x01')
    ;
    pAVar7 = (ActionMap *)(plVar4 + 2);
    if ((ActionMap *)*plVar4 == pAVar7) {
      local_198._0_8_ =
           (((Base *)&pAVar7->Keywords)->Bindings).Keywords.
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           .
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_198._8_8_ = plVar4[3];
      local_1a8 = (undefined1  [8])local_198;
    }
    else {
      local_198._0_8_ =
           (((Base *)&pAVar7->Keywords)->Bindings).Keywords.
           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           .
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1a8 = (undefined1  [8])*plVar4;
    }
    ppStack_1a0 = (pointer)plVar4[1];
    *plVar4 = (long)pAVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,(ulong)(local_198._0_8_ + 1));
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_ !=
        &local_278) {
      operator_delete((void *)local_288._0_8_,(long)local_278._M_dataplus._M_p + 1);
    }
    bVar2 = false;
    goto LAB_001d6108;
  }
  filename = pbVar1 + 1;
  filename_00 = pbVar1 + 2;
  local_258 = &local_248;
  local_250 = (char *)0x0;
  local_248 = '\0';
  __n = pbVar1[1]._M_string_length;
  if ((__n == pbVar1[2]._M_string_length) &&
     ((__n == 0 ||
      (iVar3 = bcmp((filename->_M_dataplus)._M_p,(filename_00->_M_dataplus)._M_p,__n), iVar3 == 0)))
     ) {
    std::__cxx11::string::_M_replace((ulong)&local_258,0,(char *)0x0,0x694fa1);
LAB_001d604f:
    if (local_230._8_8_ == 0) {
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001d60ea:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      value_00._M_str = local_258;
      value_00._M_len = (size_t)local_250;
      cmMakefile::AddDefinition(status->Makefile,(string *)local_230,value_00);
    }
  }
  else {
    if ((local_230[0x21] == '\0') && (bVar2 = cmsys::SystemTools::FileExists(filename), !bVar2)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     "Cannot hard link \'",filename);
      plVar4 = (long *)std::__cxx11::string::append(local_288);
      pAVar7 = (ActionMap *)(plVar4 + 2);
      if ((ActionMap *)*plVar4 == pAVar7) {
        local_198._0_8_ =
             (((Base *)&pAVar7->Keywords)->Bindings).Keywords.
             super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             .
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_198._8_8_ = plVar4[3];
        local_1a8 = (undefined1  [8])local_198;
      }
      else {
        local_198._0_8_ =
             (((Base *)&pAVar7->Keywords)->Bindings).Keywords.
             super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             .
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1a8 = (undefined1  [8])*plVar4;
      }
      ppStack_1a0 = (pointer)plVar4[1];
      *plVar4 = (long)pAVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_258,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,(ulong)(local_198._0_8_ + 1));
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_ !=
          &local_278) {
        operator_delete((void *)local_288._0_8_,(long)local_278._M_dataplus._M_p + 1);
      }
      goto LAB_001d604f;
    }
    bVar2 = cmsys::SystemTools::FileExists(filename_00);
    if (((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(filename_00), !bVar2)) ||
       (SVar5 = cmsys::SystemTools::RemoveFile(filename_00), SVar5.Kind_ == Success)) {
      if (local_230[0x21] == '\x01') {
        local_238 = cmSystemTools::CreateSymlinkQuietly(filename,filename_00);
        if (local_238.Kind_ == Success) goto LAB_001d5edc;
        local_1a8 = (undefined1  [8])0x20;
        ppStack_1a0 = (pointer)0x686f76;
        local_288._8_8_ = pbVar1[2]._M_dataplus._M_p;
        local_288._0_8_ = pbVar1[2]._M_string_length;
        cmsys::Status::GetString_abi_cxx11_((string *)(local_230 + 0x28),&local_238);
        cmStrCat<char[4],std::__cxx11::string>
                  (&local_1e8,(cmAlphaNum *)local_1a8,(cmAlphaNum *)local_288,(char (*) [4])0x6a31d0
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_230 + 0x28));
LAB_001d5e81:
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._40_8_ != &local_1f8) {
          operator_delete((void *)local_230._40_8_,local_1f8._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
      else {
        local_238 = cmSystemTools::CreateLinkQuietly(filename,filename_00);
        if (local_238.Kind_ != Success) {
          local_1a8 = (undefined1  [8])0x17;
          ppStack_1a0 = (pointer)0x686f97;
          local_288._8_8_ = pbVar1[2]._M_dataplus._M_p;
          local_288._0_8_ = pbVar1[2]._M_string_length;
          cmsys::Status::GetString_abi_cxx11_((string *)(local_230 + 0x28),&local_238);
          cmStrCat<char[4],std::__cxx11::string>
                    (&local_1e8,(cmAlphaNum *)local_1a8,(cmAlphaNum *)local_288,
                     (char (*) [4])0x6a31d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_230 + 0x28));
          goto LAB_001d5e81;
        }
LAB_001d5edc:
        bVar2 = true;
      }
      if ((!bVar2) && (local_230[0x20] == '\x01')) {
        local_1e8._M_dataplus._M_p =
             (pointer)cmsys::SystemTools::CopyFileAlways(filename,filename_00);
        if ((Kind)local_1e8._M_dataplus._M_p == Success) {
          bVar2 = true;
        }
        else {
          cmsys::Status::GetString_abi_cxx11_((string *)local_288,(Status *)&local_1e8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"Copy failed: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288);
          std::__cxx11::string::operator=((string *)&local_258,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,(ulong)(local_198._0_8_ + 1));
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_
              != &local_278) {
            operator_delete((void *)local_288._0_8_,(long)local_278._M_dataplus._M_p + 1);
          }
        }
      }
      if (bVar2) {
        std::__cxx11::string::_M_replace((ulong)&local_258,0,local_250,0x6975ea);
LAB_001d60b5:
        bVar2 = true;
        if (local_230._8_8_ != 0) {
          value_01._M_str = local_258;
          value_01._M_len = (size_t)local_250;
          cmMakefile::AddDefinition(status->Makefile,(string *)local_230,value_01);
        }
        goto LAB_001d60ec;
      }
      if (local_230._8_8_ != 0) goto LAB_001d60b5;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001d60ea;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to create link \'",0x17);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,pbVar1[2]._M_dataplus._M_p,pbVar1[2]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\' because existing path cannot be removed: ",0x2b);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_288._0_8_,local_288._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_ !=
        &local_278) {
      operator_delete((void *)local_288._0_8_,(long)local_278._M_dataplus._M_p + 1);
    }
    bVar2 = local_230._8_8_ != 0;
    if (local_230._8_8_ == 0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      this = status->Makefile;
      std::__cxx11::stringbuf::str();
      value._M_str = (char *)local_288._0_8_;
      value._M_len = local_288._8_8_;
      cmMakefile::AddDefinition(this,(string *)local_230,value);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288._0_8_ !=
        &local_278) {
      operator_delete((void *)local_288._0_8_,(long)local_278._M_dataplus._M_p + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_001d60ec:
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
LAB_001d6108:
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,CONCAT71(local_230._17_7_,local_230[0x10]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  return bVar2;
}

Assistant:

bool HandleCreateLinkCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("CREATE_LINK must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    status.SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, e.str());
      return true;
    }
    status.SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    cmsys::Status linked =
      cmSystemTools::CreateSymlinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create symbolic link '", newFileName,
                        "': ", linked.GetString());
    }
  } else {
    cmsys::Status linked =
      cmSystemTools::CreateLinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create link '", newFileName,
                        "': ", linked.GetString());
    }
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    cmsys::Status copied =
      cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (copied) {
      completed = true;
    } else {
      result = "Copy failed: " + copied.GetString();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    status.SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    status.GetMakefile().AddDefinition(arguments.Result, result);
  }

  return true;
}